

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

void Bmc_GiaGenerateJustNonRec(Gia_Man_t *p,int iFrame,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int local_3c;
  int local_38;
  int Shift;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vJustis_local;
  Vec_Bit_t *vValues_local;
  int iFrame_local;
  Gia_Man_t *p_local;
  
  local_3c = Gia_ManObjNum(p);
  local_3c = local_3c * iFrame;
  Shift = iFrame;
  do {
    if (Shift < 0) {
      return;
    }
    local_38 = p->nObjs;
    while( true ) {
      local_38 = local_38 + -1;
      bVar3 = false;
      if (-1 < local_38) {
        _k = Gia_ManObj(p,local_38);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      if (((local_38 != 0) && (iVar2 = Gia_ObjIsPi(p,_k), iVar2 == 0)) &&
         (iVar2 = Vec_BitEntry(vJustis,local_3c + local_38), iVar2 != 0)) {
        iVar2 = Gia_ObjIsAnd(_k);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsCo(_k);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsCi(_k);
            if ((iVar2 != 0) && (Shift != 0)) {
              iVar2 = Gia_ManObjNum(p);
              pObj_00 = Gia_ObjRoToRi(p,_k);
              iVar1 = Gia_ObjId(p,pObj_00);
              Vec_BitWriteEntry(vJustis,(local_3c - iVar2) + iVar1,1);
            }
          }
          else {
            iVar2 = Gia_ObjFaninId0(_k,local_38);
            Vec_BitWriteEntry(vJustis,local_3c + iVar2,1);
          }
        }
        else {
          iVar2 = Vec_BitEntry(vValues,local_3c + local_38);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjFaninId0(_k,local_38);
            iVar2 = Vec_BitEntry(vValues,local_3c + iVar2);
            iVar1 = Gia_ObjFaninC0(_k);
            if (iVar2 == iVar1) {
              iVar2 = Gia_ObjFaninId0(_k,local_38);
              Vec_BitWriteEntry(vJustis,local_3c + iVar2,1);
            }
            else {
              iVar2 = Gia_ObjFaninId1(_k,local_38);
              iVar2 = Vec_BitEntry(vValues,local_3c + iVar2);
              iVar1 = Gia_ObjFaninC1(_k);
              if (iVar2 != iVar1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                              ,0x61,
                              "void Bmc_GiaGenerateJustNonRec(Gia_Man_t *, int, Vec_Bit_t *, Vec_Bit_t *)"
                             );
              }
              iVar2 = Gia_ObjFaninId1(_k,local_38);
              Vec_BitWriteEntry(vJustis,local_3c + iVar2,1);
            }
          }
          else {
            iVar2 = Gia_ObjFaninId0(_k,local_38);
            Vec_BitWriteEntry(vJustis,local_3c + iVar2,1);
            iVar2 = Gia_ObjFaninId1(_k,local_38);
            Vec_BitWriteEntry(vJustis,local_3c + iVar2,1);
          }
        }
      }
    }
    Shift = Shift + -1;
    iVar2 = Gia_ManObjNum(p);
    local_3c = local_3c - iVar2;
  } while( true );
}

Assistant:

void Bmc_GiaGenerateJustNonRec( Gia_Man_t * p, int iFrame, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int i, k, Shift = Gia_ManObjNum(p) * iFrame;
    for ( i = iFrame; i >= 0; i--, Shift -= Gia_ManObjNum(p) )
    {
        Gia_ManForEachObjReverse( p, pObj, k )
        {
            if ( k == 0 || Gia_ObjIsPi(p, pObj) )
                continue;
            if ( !Vec_BitEntry( vJustis, Shift + k ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Vec_BitEntry( vValues, Shift + k ) )
                {
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                }
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, k) ) == Gia_ObjFaninC0(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, k) ) == Gia_ObjFaninC1(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                else assert( 0 );
            }
            else if ( Gia_ObjIsCo(pObj) )
                Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
            else if ( Gia_ObjIsCi(pObj) && i )
                Vec_BitWriteEntry( vJustis, Shift - Gia_ManObjNum(p) + Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), 1 );
        }
    }
}